

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StepExporter.cpp
# Opt level: O0

void __thiscall Assimp::StepExporter::WriteFile(StepExporter *this)

{
  bool bVar1;
  int iVar2;
  mapped_type_conflict *pmVar3;
  tm *__tp;
  ostream *poVar4;
  size_type sVar5;
  reference ppVar6;
  pointer ppVar7;
  aiVector3t<float> aVar8;
  iterator iStack_240;
  int sid;
  int local_234;
  iterator iStack_230;
  int pid3;
  int local_224;
  iterator iStack_220;
  int pid2;
  int local_214;
  undefined8 uStack_210;
  int pid1;
  float local_208;
  undefined1 local_200 [8];
  aiVector3D dv13;
  undefined1 local_1e0 [8];
  aiVector3D dv31;
  undefined1 local_1c0 [8];
  aiVector3D dv23;
  undefined1 local_1a0 [8];
  aiVector3D dv12;
  aiVector3D *v3;
  aiVector3D *v2;
  aiVector3D *v1;
  aiFace *face_1;
  aiMesh *paStack_168;
  uint j_2;
  aiMesh *mesh_2;
  undefined8 uStack_158;
  uint i_4;
  float local_150;
  undefined8 local_148;
  aiVector3D vt;
  aiVector3t<float> *local_130;
  aiVector3D *v_1;
  aiNode *paStack_120;
  uint i_3;
  mapped_type *local_118;
  aiMatrix4x4 *trafo;
  aiMesh *mesh_1;
  aiNode *paStack_100;
  uint mesh_idx;
  aiNode *node;
  _Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_> local_f0;
  iterator local_e8;
  _Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_> local_e0;
  const_iterator it2;
  int i_2;
  int i_1;
  time_t date;
  char date_str [20];
  aiVector3D *local_90;
  aiVector3D *v;
  aiFace *paStack_80;
  uint j_1;
  aiFace *face;
  aiMesh *paStack_70;
  uint j;
  aiMesh *mesh;
  uint i;
  int countFace;
  iterator it;
  VectorIndexUMap uniqueVerts;
  int faceEntryLen;
  int ind;
  aiColor4D fColor;
  StepExporter *this_local;
  
  fColor._8_8_ = this;
  std::ios_base::setf((ios_base *)(&this->mOutput + *(long *)(*(long *)this + -0x18)),_S_fixed);
  std::ios_base::precision((ios_base *)(&this->mOutput + *(long *)(*(long *)this + -0x18)),8);
  aiColor4t<float>::aiColor4t((aiColor4t<float> *)&faceEntryLen);
  faceEntryLen = 0x3f4ccccd;
  ind = 0x3f4ccccd;
  fColor.r = 0.8;
  uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 100;
  std::
  map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
  ::map((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
         *)&it);
  std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::_Rb_tree_iterator
            ((_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_> *)&i);
  mesh._4_4_ = 0;
  for (mesh._0_4_ = 0; (uint)mesh < this->mScene->mNumMeshes; mesh._0_4_ = (uint)mesh + 1) {
    paStack_70 = this->mScene->mMeshes[(uint)mesh];
    for (face._4_4_ = 0; face._4_4_ < paStack_70->mNumFaces; face._4_4_ = face._4_4_ + 1) {
      paStack_80 = paStack_70->mFaces + face._4_4_;
      if (paStack_80->mNumIndices == 3) {
        mesh._4_4_ = mesh._4_4_ + 1;
      }
    }
    for (v._4_4_ = 0; v._4_4_ < paStack_70->mNumVertices; v._4_4_ = v._4_4_ + 1) {
      local_90 = paStack_70->mVertices + v._4_4_;
      _i = std::
           map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
           ::find((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                   *)&it,&local_90);
      register0x00000000 =
           std::
           map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
           ::end((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                  *)&it);
      bVar1 = std::operator==((_Self *)&i,(_Self *)(date_str + 0x10));
      if (bVar1) {
        pmVar3 = std::
                 map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                 ::operator[]((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                               *)&it,&local_90);
        *pmVar3 = -1;
      }
    }
  }
  _i_2 = time((time_t *)0x0);
  __tp = localtime((time_t *)&i_2);
  strftime((char *)&date,0x14,"%Y-%m-%dT%H:%M:%S",__tp);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"ISO-10303-21");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"HEADER");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"FILE_DESCRIPTION((\'STEP AP214\'),\'1\')");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"FILE_NAME(\'");
  poVar4 = std::operator<<(poVar4,(string *)&this->mFile);
  poVar4 = std::operator<<(poVar4,".stp\',\'");
  poVar4 = std::operator<<(poVar4,(char *)&date);
  poVar4 = std::operator<<(poVar4,"\',(\' \'),(\' \'),\'Spatial InterOp 3D\',\' \',\' \')");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"FILE_SCHEMA((\'automotive_design\'))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"ENDSEC");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"DATA");
  std::operator<<(poVar4,(string *)&this->endstr);
  std::operator<<((ostream *)&this->field_0x10,
                  "#1=MECHANICAL_DESIGN_GEOMETRIC_PRESENTATION_REPRESENTATION(\' \',(");
  for (it2._M_node._4_4_ = 0; it2._M_node._4_4_ < mesh._4_4_;
      it2._M_node._4_4_ = it2._M_node._4_4_ + 1) {
    poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
    iVar2 = it2._M_node._4_4_ * 0x1e;
    sVar5 = std::
            map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
            ::size((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                    *)&it);
    std::ostream::operator<<(poVar4,(long)(iVar2 + 100) + sVar5 * 2);
    if (it2._M_node._4_4_ != mesh._4_4_ + -1) {
      std::operator<<((ostream *)&this->field_0x10,",");
    }
  }
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"),#6)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#2=PRODUCT_DEFINITION_CONTEXT(\'\',#7,\'design\')");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#3=APPLICATION_PROTOCOL_DEFINITION(\'INTERNATIONAL STANDARD\',\'automotive_design\',1994,#7)"
                          );
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#4=PRODUCT_CATEGORY_RELATIONSHIP(\'NONE\',\'NONE\',#8,#9)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#5=SHAPE_DEFINITION_REPRESENTATION(#10,#11)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#6= (GEOMETRIC_REPRESENTATION_CONTEXT(3)GLOBAL_UNCERTAINTY_ASSIGNED_CONTEXT((#12))GLOBAL_UNIT_ASSIGNED_CONTEXT((#13,#14,#15))REPRESENTATION_CONTEXT(\'NONE\',\'WORKSPACE\'))"
                          );
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"#7=APPLICATION_CONTEXT(\' \')");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"#8=PRODUCT_CATEGORY(\'part\',\'NONE\')");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#9=PRODUCT_RELATED_PRODUCT_CATEGORY(\'detail\',\' \',(#17))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#10=PRODUCT_DEFINITION_SHAPE(\'NONE\',\'NONE\',#18)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#11=MANIFOLD_SURFACE_SHAPE_REPRESENTATION(\'Root\',(#16,#19),#6)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#12=UNCERTAINTY_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0E-006),#13,\'\',\'\')"
                          );
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#13=(CONVERSION_BASED_UNIT(\'METRE\',#20)LENGTH_UNIT()NAMED_UNIT(#21))")
  ;
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#14=(NAMED_UNIT(#22)PLANE_ANGLE_UNIT()SI_UNIT($,.RADIAN.))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#15=(NAMED_UNIT(#22)SOLID_ANGLE_UNIT()SI_UNIT($,.STERADIAN.))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#16=SHELL_BASED_SURFACE_MODEL(\'Root\',(#29))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#17=PRODUCT(\'Root\',\'Root\',\'Root\',(#23))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#18=PRODUCT_DEFINITION(\'NONE\',\'NONE\',#24,#2)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"#19=AXIS2_PLACEMENT_3D(\'\',#25,#26,#27)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#20=LENGTH_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0),#28)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#21=DIMENSIONAL_EXPONENTS(1.0,0.0,0.0,0.0,0.0,0.0,0.0)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#22=DIMENSIONAL_EXPONENTS(0.0,0.0,0.0,0.0,0.0,0.0,0.0)");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#23=PRODUCT_CONTEXT(\'\',#7,\'mechanical\')");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#24=PRODUCT_DEFINITION_FORMATION_WITH_SPECIFIED_SOURCE(\' \',\'NONE\',#17,.NOT_KNOWN.)"
                          );
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"#25=CARTESIAN_POINT(\'\',(0.0,0.0,0.0))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"#26=DIRECTION(\'\',(0.0,0.0,1.0))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"#27=DIRECTION(\'\',(1.0,0.0,0.0))");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,
                           "#28= (NAMED_UNIT(#21)LENGTH_UNIT()SI_UNIT(.MILLI.,.METRE.))");
  std::operator<<(poVar4,(string *)&this->endstr);
  std::operator<<((ostream *)&this->field_0x10,"#29=CLOSED_SHELL(\'\',(");
  for (it2._M_node._0_4_ = 0; (int)it2._M_node < mesh._4_4_;
      it2._M_node._0_4_ = (int)it2._M_node + 1) {
    poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
    iVar2 = (int)it2._M_node * 0x1e;
    sVar5 = std::
            map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
            ::size((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                    *)&it);
    std::ostream::operator<<(poVar4,(long)(iVar2 + 100) + 8 + sVar5 * 2);
    if ((int)it2._M_node != mesh._4_4_ + -1) {
      std::operator<<((ostream *)&this->field_0x10,",");
    }
  }
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"))");
  std::operator<<(poVar4,(string *)&this->endstr);
  local_e8._M_node =
       (_Base_ptr)
       std::
       multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
       ::begin(&this->meshes);
  std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::
  _Rb_tree_const_iterator(&local_e0,&local_e8);
  while( true ) {
    node = (aiNode *)
           std::
           multimap<const_aiNode_*,_unsigned_int,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_unsigned_int>_>_>
           ::end(&this->meshes);
    std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::
    _Rb_tree_const_iterator(&local_f0,(iterator *)&node);
    bVar1 = std::operator!=(&local_e0,&local_f0);
    if (!bVar1) break;
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::operator*
                       (&local_e0);
    paStack_100 = ppVar6->first;
    ppVar6 = std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::operator*
                       (&local_e0);
    mesh_1._4_4_ = ppVar6->second;
    trafo = (aiMatrix4x4 *)this->mScene->mMeshes[mesh_1._4_4_];
    paStack_120 = paStack_100;
    local_118 = std::
                map<const_aiNode_*,_aiMatrix4x4t<float>,_std::less<const_aiNode_*>,_std::allocator<std::pair<const_aiNode_*const,_aiMatrix4x4t<float>_>_>_>
                ::operator[](&this->trafos,&stack0xfffffffffffffee0);
    for (v_1._4_4_ = 0.0; (uint)v_1._4_4_ < (uint)trafo->a2; v_1._4_4_ = (float)((int)v_1._4_4_ + 1)
        ) {
      local_130 = (aiVector3t<float> *)(*(long *)&trafo->b1 + (ulong)(uint)v_1._4_4_ * 0xc);
      register0x00000000 =
           std::
           map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
           ::find((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                   *)&it,&local_130);
      _i = register0x00000000;
      ppVar7 = std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::operator->
                         ((_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_> *)&i);
      if (ppVar7->second < 0) {
        ppVar7 = std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::operator->
                           ((_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_> *)&i);
        ppVar7->second = uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_;
        aVar8 = ::operator*(local_118,local_130);
        local_150 = aVar8.z;
        uStack_158 = aVar8._0_8_;
        local_148 = uStack_158;
        vt.x = local_150;
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        ppVar7 = std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::operator->
                           ((_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_> *)&i);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar7->second);
        poVar4 = std::operator<<(poVar4,"=CARTESIAN_POINT(\'\',(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_148);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_148._4_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,vt.x);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        ppVar7 = std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::operator->
                           ((_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_> *)&i);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar7->second + 1);
        poVar4 = std::operator<<(poVar4,"=VERTEX_POINT(\'\',#");
        ppVar7 = std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::operator->
                           ((_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_> *)&i);
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,ppVar7->second);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 2;
      }
    }
    std::_Rb_tree_const_iterator<std::pair<const_aiNode_*const,_unsigned_int>_>::operator++
              (&local_e0);
  }
  for (mesh_2._4_4_ = 0; mesh_2._4_4_ < this->mScene->mNumMeshes; mesh_2._4_4_ = mesh_2._4_4_ + 1) {
    paStack_168 = this->mScene->mMeshes[mesh_2._4_4_];
    for (face_1._4_4_ = 0; face_1._4_4_ < paStack_168->mNumFaces; face_1._4_4_ = face_1._4_4_ + 1) {
      v1 = (aiVector3D *)(paStack_168->mFaces + face_1._4_4_);
      if (((aiFace *)v1)->mNumIndices == 3) {
        v2 = paStack_168->mVertices + *((aiFace *)v1)->mIndices;
        v3 = paStack_168->mVertices + ((aiFace *)v1)->mIndices[1];
        unique0x00004a80 = paStack_168->mVertices + ((aiFace *)v1)->mIndices[2];
        aVar8 = ::operator-(v3,v2);
        dv12.x = aVar8.z;
        unique0x10000db4 = aVar8._0_8_;
        local_1a0 = (undefined1  [8])unique0x10000db4;
        aVar8 = ::operator-(stack0xfffffffffffffe70,v3);
        dv23.x = aVar8.z;
        unique0x10000dd8 = aVar8._0_8_;
        local_1c0 = (undefined1  [8])unique0x10000dd8;
        aVar8 = ::operator-(v2,stack0xfffffffffffffe70);
        dv31.x = aVar8.z;
        unique0x10000dfc = aVar8._0_8_;
        local_1e0 = (undefined1  [8])unique0x10000dfc;
        aVar8 = ::operator-(stack0xfffffffffffffe70,v2);
        local_208 = aVar8.z;
        uStack_210 = aVar8._0_8_;
        local_200 = (undefined1  [8])uStack_210;
        dv13.x = local_208;
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_1a0);
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_1c0);
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_1e0);
        aiVector3t<float>::Normalize((aiVector3t<float> *)local_200);
        iStack_220 = std::
                     map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                     ::find((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                             *)&it,&v2);
        ppVar7 = std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::operator->
                           (&stack0xfffffffffffffde0);
        local_214 = ppVar7->second;
        iStack_230 = std::
                     map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                     ::find((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                             *)&it,&v3);
        ppVar7 = std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::operator->
                           (&stack0xfffffffffffffdd0);
        local_224 = ppVar7->second;
        iStack_240 = std::
                     map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                     ::find((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
                             *)&it,(key_type *)&dv12.z);
        ppVar7 = std::_Rb_tree_iterator<std::pair<aiVector3t<float>_*const,_int>_>::operator->
                           (&stack0xfffffffffffffdc0);
        local_234 = ppVar7->second;
        bVar1 = aiMesh::HasVertexColors(paStack_168,0);
        if (bVar1) {
          faceEntryLen = 0;
          ind = 0;
          fColor.r = 0.0;
          aiColor4t<float>::operator+=
                    ((aiColor4t<float> *)&faceEntryLen,paStack_168->mColors[0] + **(uint **)&v1->z);
          aiColor4t<float>::operator+=
                    ((aiColor4t<float> *)&faceEntryLen,
                     paStack_168->mColors[0] + *(uint *)(*(long *)&v1->z + 4));
          aiColor4t<float>::operator+=
                    ((aiColor4t<float> *)&faceEntryLen,
                     paStack_168->mColors[0] + *(uint *)(*(long *)&v1->z + 8));
          aiColor4t<float>::operator/=((aiColor4t<float> *)&faceEntryLen,3.0);
        }
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_);
        poVar4 = std::operator<<(poVar4,"=STYLED_ITEM(\'\',(#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 1);
        poVar4 = std::operator<<(poVar4,"),#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 8);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 1);
        poVar4 = std::operator<<(poVar4,"=PRESENTATION_STYLE_ASSIGNMENT((#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 2);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 2);
        poVar4 = std::operator<<(poVar4,"=SURFACE_STYLE_USAGE(.BOTH.,#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 3);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 3);
        poVar4 = std::operator<<(poVar4,"=SURFACE_SIDE_STYLE(\'\',(#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 4);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 4);
        poVar4 = std::operator<<(poVar4,"=SURFACE_STYLE_FILL_AREA(#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 5);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 5);
        poVar4 = std::operator<<(poVar4,"=FILL_AREA_STYLE(\'\',(#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 6);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 6);
        poVar4 = std::operator<<(poVar4,"=FILL_AREA_STYLE_COLOUR(\'\',#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 7);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 7);
        poVar4 = std::operator<<(poVar4,"=COLOUR_RGB(\'\',");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)faceEntryLen);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)ind);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,fColor.r);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 8);
        poVar4 = std::operator<<(poVar4,"=FACE_SURFACE(\'\',(#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xd);
        poVar4 = std::operator<<(poVar4,"),#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 9);
        poVar4 = std::operator<<(poVar4,",.T.)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 9);
        poVar4 = std::operator<<(poVar4,"=PLANE(\'\',#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 10);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 10);
        poVar4 = std::operator<<(poVar4,"=AXIS2_PLACEMENT_3D(\'\',#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_214);
        poVar4 = std::operator<<(poVar4,", #");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xb);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xc);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xb);
        poVar4 = std::operator<<(poVar4,"=DIRECTION(\'\',(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_1a0._0_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_1a0._4_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dv12.x);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xc);
        poVar4 = std::operator<<(poVar4,"=DIRECTION(\'\',(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_200._0_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_200._4_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dv13.x);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xd);
        poVar4 = std::operator<<(poVar4,"=FACE_BOUND(\'\',#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xe);
        poVar4 = std::operator<<(poVar4,",.T.)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xe);
        poVar4 = std::operator<<(poVar4,"=EDGE_LOOP(\'\',(#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xf);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x10);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x11);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0xf);
        poVar4 = std::operator<<(poVar4,"=ORIENTED_EDGE(\'\',*,*,#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x12);
        poVar4 = std::operator<<(poVar4,",.T.)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x10);
        poVar4 = std::operator<<(poVar4,"=ORIENTED_EDGE(\'\',*,*,#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x13);
        poVar4 = std::operator<<(poVar4,",.T.)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x11);
        poVar4 = std::operator<<(poVar4,"=ORIENTED_EDGE(\'\',*,*,#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x14);
        poVar4 = std::operator<<(poVar4,",.T.)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x12);
        poVar4 = std::operator<<(poVar4,"=EDGE_CURVE(\'\',#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_214 + 1);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_224 + 1);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x15);
        poVar4 = std::operator<<(poVar4,",.F.)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x13);
        poVar4 = std::operator<<(poVar4,"=EDGE_CURVE(\'\',#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_224 + 1);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_234 + 1);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x16);
        poVar4 = std::operator<<(poVar4,",.T.)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x14);
        poVar4 = std::operator<<(poVar4,"=EDGE_CURVE(\'\',#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_234 + 1);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_214 + 1);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x17);
        poVar4 = std::operator<<(poVar4,",.T.)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x15);
        poVar4 = std::operator<<(poVar4,"=LINE(\'\',#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_214);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x18);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x16);
        poVar4 = std::operator<<(poVar4,"=LINE(\'\',#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_224);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x19);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x17);
        poVar4 = std::operator<<(poVar4,"=LINE(\'\',#");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_234);
        poVar4 = std::operator<<(poVar4,",#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x1a);
        poVar4 = std::operator<<(poVar4,")");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x18);
        poVar4 = std::operator<<(poVar4,"=VECTOR(\'\',#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x1b);
        poVar4 = std::operator<<(poVar4,",1.0)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x19);
        poVar4 = std::operator<<(poVar4,"=VECTOR(\'\',#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x1c);
        poVar4 = std::operator<<(poVar4,",1.0)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x1a);
        poVar4 = std::operator<<(poVar4,"=VECTOR(\'\',#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x1d);
        poVar4 = std::operator<<(poVar4,",1.0)");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x1b);
        poVar4 = std::operator<<(poVar4,"=DIRECTION(\'\',(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_1a0._0_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_1a0._4_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dv12.x);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x1c);
        poVar4 = std::operator<<(poVar4,"=DIRECTION(\'\',(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_1c0._0_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_1c0._4_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dv23.x);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        poVar4 = std::operator<<((ostream *)&this->field_0x10,"#");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           (poVar4,uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count.
                                   _4_4_ + 0x1d);
        poVar4 = std::operator<<(poVar4,"=DIRECTION(\'\',(");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_1e0._0_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,(float)local_1e0._4_4_);
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)std::ostream::operator<<(poVar4,dv31.x);
        poVar4 = std::operator<<(poVar4,"))");
        std::operator<<(poVar4,(string *)&this->endstr);
        uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ =
             uniqueVerts._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ + 0x1e;
      }
    }
  }
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"ENDSEC");
  std::operator<<(poVar4,(string *)&this->endstr);
  poVar4 = std::operator<<((ostream *)&this->field_0x10,"END-ISO-10303-21");
  std::operator<<(poVar4,(string *)&this->endstr);
  std::
  map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
  ::~map((map<aiVector3t<float>_*,_int,_std::less<aiVector3t<float>_*>,_std::allocator<std::pair<aiVector3t<float>_*const,_int>_>_>
          *)&it);
  return;
}

Assistant:

void StepExporter::WriteFile()
{
    // see http://shodhganga.inflibnet.ac.in:8080/jspui/bitstream/10603/14116/11/11_chapter%203.pdf
    // note, that all realnumber values must be comma separated in x files
    mOutput.setf(std::ios::fixed);
    // precision for double
    // see http://stackoverflow.com/questions/554063/how-do-i-print-a-double-value-with-full-precision-using-cout
    mOutput.precision(ASSIMP_AI_REAL_TEXT_PRECISION);

    // standard color
    aiColor4D fColor;
    fColor.r = 0.8f;
    fColor.g = 0.8f;
    fColor.b = 0.8f;

    int ind = 100; // the start index to be used
    int faceEntryLen = 30; // number of entries for a triangle/face
    // prepare unique (count triangles and vertices)

    VectorIndexUMap uniqueVerts; // use a map to reduce find complexity to log(n)
    VectorIndexUMap::iterator it;
    int countFace = 0;

    for (unsigned int i=0; i<mScene->mNumMeshes; ++i)
    {
        aiMesh* mesh = mScene->mMeshes[i];
        for (unsigned int j=0; j<mesh->mNumFaces; ++j)
        {
            aiFace* face = &(mesh->mFaces[j]);

            if (face->mNumIndices == 3) countFace++;
        }
        for (unsigned int j=0; j<mesh->mNumVertices; ++j)
        {
            aiVector3D* v = &(mesh->mVertices[j]);
            it =uniqueVerts.find(v);
            if (it == uniqueVerts.end())
            {
                uniqueVerts[v] = -1; // first mark the vector as not transformed
            }
        }
    }

    static const unsigned int date_nb_chars = 20;
    char date_str[date_nb_chars];
    std::time_t date = std::time(NULL);
    std::strftime(date_str, date_nb_chars, "%Y-%m-%dT%H:%M:%S", std::localtime(&date));

    // write the header
    mOutput << "ISO-10303-21" << endstr;
    mOutput << "HEADER" << endstr;
    mOutput << "FILE_DESCRIPTION(('STEP AP214'),'1')" << endstr;
    mOutput << "FILE_NAME('" << mFile << ".stp','" << date_str << "',(' '),(' '),'Spatial InterOp 3D',' ',' ')" << endstr;
    mOutput << "FILE_SCHEMA(('automotive_design'))" << endstr;
    mOutput << "ENDSEC" << endstr;

    // write the top of data
    mOutput << "DATA" << endstr;
    mOutput << "#1=MECHANICAL_DESIGN_GEOMETRIC_PRESENTATION_REPRESENTATION(' ',(";
    for (int i=0; i<countFace; ++i)
    {
        mOutput << "#" << i*faceEntryLen + ind + 2*uniqueVerts.size();
        if (i!=countFace-1) mOutput << ",";
    }
    mOutput << "),#6)" << endstr;

    mOutput << "#2=PRODUCT_DEFINITION_CONTEXT('',#7,'design')" << endstr;
    mOutput << "#3=APPLICATION_PROTOCOL_DEFINITION('INTERNATIONAL STANDARD','automotive_design',1994,#7)" << endstr;
    mOutput << "#4=PRODUCT_CATEGORY_RELATIONSHIP('NONE','NONE',#8,#9)" << endstr;
    mOutput << "#5=SHAPE_DEFINITION_REPRESENTATION(#10,#11)" << endstr;
    mOutput << "#6= (GEOMETRIC_REPRESENTATION_CONTEXT(3)GLOBAL_UNCERTAINTY_ASSIGNED_CONTEXT((#12))GLOBAL_UNIT_ASSIGNED_CONTEXT((#13,#14,#15))REPRESENTATION_CONTEXT('NONE','WORKSPACE'))" << endstr;
    mOutput << "#7=APPLICATION_CONTEXT(' ')" << endstr;
    mOutput << "#8=PRODUCT_CATEGORY('part','NONE')" << endstr;
    mOutput << "#9=PRODUCT_RELATED_PRODUCT_CATEGORY('detail',' ',(#17))" << endstr;
    mOutput << "#10=PRODUCT_DEFINITION_SHAPE('NONE','NONE',#18)" << endstr;
    mOutput << "#11=MANIFOLD_SURFACE_SHAPE_REPRESENTATION('Root',(#16,#19),#6)" << endstr;
    mOutput << "#12=UNCERTAINTY_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0E-006),#13,'','')" << endstr;
    mOutput << "#13=(CONVERSION_BASED_UNIT('METRE',#20)LENGTH_UNIT()NAMED_UNIT(#21))" << endstr;
    mOutput << "#14=(NAMED_UNIT(#22)PLANE_ANGLE_UNIT()SI_UNIT($,.RADIAN.))" << endstr;
    mOutput << "#15=(NAMED_UNIT(#22)SOLID_ANGLE_UNIT()SI_UNIT($,.STERADIAN.))" << endstr;
    mOutput << "#16=SHELL_BASED_SURFACE_MODEL('Root',(#29))" << endstr;
    mOutput << "#17=PRODUCT('Root','Root','Root',(#23))" << endstr;
    mOutput << "#18=PRODUCT_DEFINITION('NONE','NONE',#24,#2)" << endstr;
    mOutput << "#19=AXIS2_PLACEMENT_3D('',#25,#26,#27)" << endstr;
    mOutput << "#20=LENGTH_MEASURE_WITH_UNIT(LENGTH_MEASURE(1.0),#28)" << endstr;
    mOutput << "#21=DIMENSIONAL_EXPONENTS(1.0,0.0,0.0,0.0,0.0,0.0,0.0)" << endstr;
    mOutput << "#22=DIMENSIONAL_EXPONENTS(0.0,0.0,0.0,0.0,0.0,0.0,0.0)" << endstr;
    mOutput << "#23=PRODUCT_CONTEXT('',#7,'mechanical')" << endstr;
    mOutput << "#24=PRODUCT_DEFINITION_FORMATION_WITH_SPECIFIED_SOURCE(' ','NONE',#17,.NOT_KNOWN.)" << endstr;
    mOutput << "#25=CARTESIAN_POINT('',(0.0,0.0,0.0))" << endstr;
    mOutput << "#26=DIRECTION('',(0.0,0.0,1.0))" << endstr;
    mOutput << "#27=DIRECTION('',(1.0,0.0,0.0))" << endstr;
    mOutput << "#28= (NAMED_UNIT(#21)LENGTH_UNIT()SI_UNIT(.MILLI.,.METRE.))" << endstr;
    mOutput << "#29=CLOSED_SHELL('',(";
    for (int i=0; i<countFace; ++i)
    {
        mOutput << "#" << i*faceEntryLen + ind + 2*uniqueVerts.size() + 8;
        if (i!=countFace-1) mOutput << ",";
    }
    mOutput << "))" << endstr;

    // write all the unique transformed CARTESIAN and VERTEX
    for (MeshesByNodeMap::const_iterator it2 = meshes.begin(); it2 != meshes.end(); ++it2)
    {
        const aiNode& node = *(*it2).first;
        unsigned int mesh_idx = (*it2).second;

        const aiMesh* mesh = mScene->mMeshes[mesh_idx];
        aiMatrix4x4& trafo = trafos[&node];
        for (unsigned int i = 0; i < mesh->mNumVertices; ++i)
        {
            aiVector3D* v = &(mesh->mVertices[i]);
            it = uniqueVerts.find(v);
            if (it->second >=0 ) continue;
            it->second = ind; // this one is new, so set the index (ind)
            aiVector3D vt = trafo * (*v); // transform the coordinate
            mOutput << "#" << it->second << "=CARTESIAN_POINT('',(" << vt.x << "," << vt.y << "," << vt.z << "))" << endstr;
            mOutput << "#" << it->second+1 << "=VERTEX_POINT('',#" << it->second << ")" << endstr;
            ind += 2;
        }
    }

    // write the triangles
    for (unsigned int i=0; i<mScene->mNumMeshes; ++i)
    {
        aiMesh* mesh = mScene->mMeshes[i];
        for (unsigned int j=0; j<mesh->mNumFaces; ++j)
        {
            aiFace* face = &(mesh->mFaces[j]);

            if (face->mNumIndices != 3) continue;

            aiVector3D* v1 = &(mesh->mVertices[face->mIndices[0]]);
            aiVector3D* v2 = &(mesh->mVertices[face->mIndices[1]]);
            aiVector3D* v3 = &(mesh->mVertices[face->mIndices[2]]);
            aiVector3D dv12 = *v2 - *v1;
            aiVector3D dv23 = *v3 - *v2;
            aiVector3D dv31 = *v1 - *v3;
            aiVector3D dv13 = *v3 - *v1;
            dv12.Normalize();
            dv23.Normalize();
            dv31.Normalize();
            dv13.Normalize();

            int pid1 = uniqueVerts.find(v1)->second;
            int pid2 = uniqueVerts.find(v2)->second;
            int pid3 = uniqueVerts.find(v3)->second;

            // mean vertex color for the face if available
            if (mesh->HasVertexColors(0))
            {
                fColor.r = 0.0;
                fColor.g = 0.0;
                fColor.b = 0.0;
                fColor += mesh->mColors[0][face->mIndices[0]];
                fColor += mesh->mColors[0][face->mIndices[1]];
                fColor += mesh->mColors[0][face->mIndices[2]];
                fColor /= 3.0f;
            }

            int sid = ind; // the sub index
            mOutput << "#" << sid << "=STYLED_ITEM('',(#" << sid+1 << "),#" << sid+8 << ")" << endstr; /* the item that must be referenced in #1 */
            /* This is the color information of the Triangle */
            mOutput << "#" << sid+1 << "=PRESENTATION_STYLE_ASSIGNMENT((#" << sid+2 << "))" << endstr;
            mOutput << "#" << sid+2 << "=SURFACE_STYLE_USAGE(.BOTH.,#" << sid+3 << ")" << endstr;
            mOutput << "#" << sid+3 << "=SURFACE_SIDE_STYLE('',(#" << sid+4 << "))" << endstr;
            mOutput << "#" << sid+4 << "=SURFACE_STYLE_FILL_AREA(#" << sid+5 << ")" << endstr;
            mOutput << "#" << sid+5 << "=FILL_AREA_STYLE('',(#" << sid+6 << "))" << endstr;
            mOutput << "#" << sid+6 << "=FILL_AREA_STYLE_COLOUR('',#" << sid+7 << ")" << endstr;
            mOutput << "#" << sid+7 << "=COLOUR_RGB(''," << fColor.r << "," << fColor.g << "," << fColor.b << ")" << endstr;

            /* this is the geometry */
            mOutput << "#" << sid+8 << "=FACE_SURFACE('',(#" << sid+13 << "),#" << sid+9<< ",.T.)" << endstr; /* the face that must be referenced in 29 */

            /* 2 directions of the plane */
            mOutput << "#" << sid+9 << "=PLANE('',#" << sid+10 << ")" << endstr;
            mOutput << "#" << sid+10 << "=AXIS2_PLACEMENT_3D('',#" << pid1 << ", #" << sid+11 << ",#" << sid+12 << ")" << endstr;

            mOutput << "#" << sid+11 << "=DIRECTION('',(" << dv12.x << "," << dv12.y << "," << dv12.z << "))" << endstr;
            mOutput << "#" << sid+12 << "=DIRECTION('',(" << dv13.x << "," << dv13.y << "," << dv13.z << "))" << endstr;

            mOutput << "#" << sid+13 << "=FACE_BOUND('',#" << sid+14 << ",.T.)" << endstr;
            mOutput << "#" << sid+14 << "=EDGE_LOOP('',(#" << sid+15 << ",#" << sid+16 << ",#" << sid+17 << "))" << endstr;

            /* edge loop  */
            mOutput << "#" << sid+15 << "=ORIENTED_EDGE('',*,*,#" << sid+18 << ",.T.)" << endstr;
            mOutput << "#" << sid+16 << "=ORIENTED_EDGE('',*,*,#" << sid+19 << ",.T.)" << endstr;
            mOutput << "#" << sid+17 << "=ORIENTED_EDGE('',*,*,#" << sid+20 << ",.T.)" << endstr;

            /* oriented edges */
            mOutput << "#" << sid+18 << "=EDGE_CURVE('',#" << pid1+1 << ",#" << pid2+1 << ",#" << sid+21 << ",.F.)" << endstr;
            mOutput << "#" << sid+19 << "=EDGE_CURVE('',#" << pid2+1 << ",#" << pid3+1 << ",#" << sid+22 << ",.T.)" << endstr;
            mOutput << "#" << sid+20 << "=EDGE_CURVE('',#" << pid3+1 << ",#" << pid1+1 << ",#" << sid+23 << ",.T.)" << endstr;

            /* 3 lines and 3 vectors for the lines for the 3 edge curves */
            mOutput << "#" << sid+21 << "=LINE('',#" << pid1 << ",#" << sid+24 << ")" << endstr;
            mOutput << "#" << sid+22 << "=LINE('',#" << pid2 << ",#" << sid+25 << ")" << endstr;
            mOutput << "#" << sid+23 << "=LINE('',#" << pid3 << ",#" << sid+26 << ")" << endstr;
            mOutput << "#" << sid+24 << "=VECTOR('',#" << sid+27 << ",1.0)" << endstr;
            mOutput << "#" << sid+25 << "=VECTOR('',#" << sid+28 << ",1.0)" << endstr;
            mOutput << "#" << sid+26 << "=VECTOR('',#" << sid+29 << ",1.0)" << endstr;
            mOutput << "#" << sid+27 << "=DIRECTION('',(" << dv12.x << "," << dv12.y << "," << dv12.z << "))" << endstr;
            mOutput << "#" << sid+28 << "=DIRECTION('',(" << dv23.x << "," << dv23.y << "," << dv23.z << "))" << endstr;
            mOutput << "#" << sid+29 << "=DIRECTION('',(" << dv31.x << "," << dv31.y << "," << dv31.z << "))" << endstr;
            ind += faceEntryLen; // increase counter
        }
    }

    mOutput << "ENDSEC" << endstr; // end of data section
    mOutput << "END-ISO-10303-21" << endstr; // end of file
}